

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  iterator f;
  bool bVar1;
  value_type *in_RDI;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  int i;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_;
  iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  iterator *in_stack_fffffffffffff908;
  undefined8 uVar2;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff910;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  uint *in_stack_fffffffffffff918;
  uint *lhs;
  char *in_stack_fffffffffffff920;
  char *rhs_expression;
  char *in_stack_fffffffffffff928;
  int iVar3;
  char *lhs_expression;
  char *in_stack_fffffffffffff930;
  char *file;
  undefined8 in_stack_fffffffffffff938;
  Type TVar5;
  undefined8 uVar4;
  AssertHelper *in_stack_fffffffffffff940;
  AssertHelper *this_01;
  char *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff978;
  char *in_stack_fffffffffffff980;
  AssertionResult *in_stack_fffffffffffff988;
  AssertHelper *in_stack_fffffffffffff990;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9a0;
  key_type *in_stack_fffffffffffff9a8;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  value_type *pvVar6;
  value_type *pvVar7;
  char *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffff9e8;
  nonempty_iterator piVar8;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  value_type *pvVar9;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  undefined1 in_stack_fffffffffffffa58 [16];
  undefined8 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  AssertionResult in_stack_fffffffffffffa78;
  iterator in_stack_fffffffffffffa88;
  undefined1 local_528 [56];
  Message *pMStack_4f0;
  AssertHelper *local_4e8;
  undefined1 local_4e0 [80];
  undefined1 local_490 [8];
  AssertHelper *pAStack_488;
  uint *local_480;
  char *pcStack_478;
  char *local_470;
  char *pcStack_468;
  undefined8 local_460;
  Type TStack_45c;
  AssertHelper *pAStack_458;
  size_type local_438;
  undefined4 local_42c;
  AssertionResult local_428 [6];
  value_type local_3c0;
  int local_3bc;
  size_type local_3a8;
  undefined4 local_39c;
  AssertionResult local_398;
  undefined8 local_388;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_380;
  uint *local_378;
  char *pcStack_370;
  char *local_368;
  char *pcStack_360;
  undefined8 local_358;
  AssertHelper *pAStack_350;
  string local_340 [135];
  undefined1 local_2b9;
  AssertionResult local_2b8;
  key_type local_2a4;
  undefined1 local_2a0 [96];
  size_type local_240;
  undefined4 local_234;
  AssertionResult local_230 [2];
  key_type local_20c;
  size_type local_208;
  undefined4 local_1fc;
  AssertionResult local_1f8 [2];
  size_type local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8 [2];
  key_type local_1a4;
  size_type local_1a0;
  undefined4 local_194;
  AssertionResult local_190 [2];
  size_type local_170;
  undefined4 local_164;
  AssertionResult local_160 [2];
  key_type local_13c;
  size_type local_138;
  undefined4 local_12c;
  AssertionResult local_128 [6];
  value_type local_bc;
  value_type local_5c;
  key_type local_34;
  size_type local_30;
  undefined4 local_24;
  AssertionResult local_20;
  key_type local_c;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffff938 >> 0x20);
  pvVar9 = in_RDI + 4;
  local_c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  local_24 = 0;
  this_03 = (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 4);
  local_34 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  local_30 = google::
             BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xe89cc3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xe89d26);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe89d97);
  local_5c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff910,
                            (int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_03,in_RDI);
  local_bc = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff910,
                            (int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_03,in_RDI);
  local_12c = 1;
  this_02 = (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 4);
  local_13c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20))
  ;
  local_138 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xe89ee2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xe89f45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe89fb3);
  local_164 = 1;
  local_170 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe89fcf);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xe8a048);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xe8a0ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8a11c);
  local_194 = 0;
  local_1a4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20))
  ;
  local_1a0 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xe8a1dd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xe8a240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8a2ae);
  local_1cc = 1;
  local_1d8 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe8a2ca);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::AssertionResult::failure_message((AssertionResult *)0xe8a343);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xe8a3a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8a417);
  local_1fc = 0;
  piVar8 = in_RDI + 4;
  local_20c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20))
  ;
  local_208 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    in_stack_fffffffffffff9e8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe8a4d8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xe8a53b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8a5a9);
  local_234 = 1;
  local_240 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe8a5c5);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (unsigned_long *)in_stack_fffffffffffff910);
  iVar3 = (int)((ulong)in_stack_fffffffffffff928 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    in_stack_fffffffffffff9e0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe8a63e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,iVar3,
               in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    testing::Message::~Message((Message *)0xe8a6a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8a712);
  pvVar7 = in_RDI + 4;
  local_2a4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffff9b0);
  local_2b9 = google::
              sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff910,(bool *)in_stack_fffffffffffff908,
             (type *)0xe8a7a7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff940,TVar5,in_stack_fffffffffffff930,iVar3,
               in_stack_fffffffffffff920);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff910);
    std::__cxx11::string::~string(local_340);
    testing::Message::~Message((Message *)0xe8a87a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8a911);
  pvVar6 = in_RDI + 4;
  memcpy(&local_388,local_2a0,0x48);
  it_00.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffff9b8;
  it_00.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff9b0;
  it_00.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffff9c0;
  it_00.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffff9c8;
  it_00.pos.col_current = pvVar6;
  it_00.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       pvVar7;
  it_00.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffff9e0;
  it_00.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffff9e8;
  it_00.end.col_current = piVar8;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffff9a0,it_00);
  local_39c = 0;
  local_3a8 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe8a9a6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_368,pcStack_370,local_378,(unsigned_long *)pHStack_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  uVar2 = local_388;
  this_00 = pHStack_380;
  lhs = local_378;
  rhs_expression = pcStack_370;
  lhs_expression = local_368;
  file = pcStack_360;
  uVar4 = local_358;
  this_01 = pAStack_350;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_350);
    testing::AssertionResult::failure_message((AssertionResult *)0xe8aa1f);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_350,(Type)((ulong)local_358 >> 0x20),pcStack_360,
               (int)((ulong)local_368 >> 0x20),pcStack_370);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pHStack_380);
    testing::Message::~Message((Message *)0xe8aa82);
    uVar2 = local_388;
    this_00 = pHStack_380;
    lhs = local_378;
    rhs_expression = pcStack_370;
    lhs_expression = local_368;
    file = pcStack_360;
    uVar4 = local_358;
    this_01 = pAStack_350;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8aaf0);
  local_3bc = 10;
  while( true ) {
    TVar5 = (Type)((ulong)uVar4 >> 0x20);
    if (99 < local_3bc) break;
    local_3c0 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(this_00,(int)((ulong)uVar2 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(this_03,in_RDI);
    local_3bc = local_3bc + 1;
  }
  local_42c = 0x5a;
  local_438 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe8ab8d);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,lhs,(unsigned_long *)this_00);
  iVar3 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xe8abf4);
    testing::internal::AssertHelper::AssertHelper(this_01,TVar5,file,iVar3,rhs_expression);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xe8ac57);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8acc8);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff9b0);
  memcpy(local_490,local_4e0,0x48);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffff9b0);
  memcpy(local_528,&stack0xfffffffffffffa88,0x48);
  f.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_RDI;
  f.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)pvVar9;
  f.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       this_03;
  f.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffa58._0_8_;
  f.pos.col_current = (nonempty_iterator)in_stack_fffffffffffffa58._8_8_;
  f.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffa68;
  f.end.row_end._M_current._0_4_ = in_stack_fffffffffffffa70;
  f.end.row_end._M_current._4_4_ = in_stack_fffffffffffffa74;
  f.end._16_16_ = in_stack_fffffffffffffa78;
  TVar5 = TStack_45c;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(this_02,f,in_stack_fffffffffffffa88);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe8adeb);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_470,pcStack_478,local_480,(unsigned_long *)pAStack_488);
  iVar3 = (int)((ulong)local_470 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffa78);
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_458);
    testing::AssertionResult::failure_message((AssertionResult *)0xe8ae64);
    testing::internal::AssertHelper::AssertHelper(pAStack_458,TVar5,pcStack_468,iVar3,pcStack_478);
    testing::internal::AssertHelper::operator=(local_4e8,pMStack_4f0);
    testing::internal::AssertHelper::~AssertHelper(pAStack_488);
    testing::Message::~Message((Message *)0xe8aec7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe8af32);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}